

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cConditionalRenderInvertedTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::ConditionalRenderInverted::FunctionalTest::iterate(FunctionalTest *this)

{
  ostringstream *poVar1;
  GLenum condition_mode_or_query_target;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  ContextType ctxType;
  GLchar *pGVar5;
  long lVar6;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  TestContext *this_00;
  long lVar10;
  GLfloat GVar11;
  float fVar12;
  float fVar13;
  float local_1c8;
  undefined1 local_1b0 [384];
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar3 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     "GL_ARB_conditional_render_inverted");
  if ((bVar2) || (bVar3)) {
    createProgram(this);
    createView(this);
    createVertexArrayObject(this);
    bVar2 = true;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
      for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
        pcVar7 = "unknow mode";
        if (lVar10 == 0) {
          pcVar7 = "GL_SAMPLES_PASSED";
        }
        if (lVar10 == 1) {
          pcVar7 = "GL_ANY_SAMPLES_PASSED";
        }
        for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 4) {
          createQueryObject(this);
          setupColor(this,1.0);
          bVar3 = iterate::render_cases[lVar6];
          setupPassSwitch(this,bVar3);
          clearView(this);
          draw(this,false,iterate::query_cases[lVar10]);
          bVar4 = fragmentsPassed(this);
          if (bVar3 == bVar4) {
            setupColor(this,0.0);
            setupPassSwitch(this,true);
            condition_mode_or_query_target = *(GLenum *)((long)CoverageTest::iterate::modes + lVar8)
            ;
            draw(this,true,condition_mode_or_query_target);
            local_1c8 = 1.0;
            if (bVar3 == false) {
              local_1c8 = 0.0;
            }
            GVar11 = readPixel(this);
            fVar13 = local_1c8 - GVar11;
            fVar12 = -fVar13;
            if (-fVar13 <= fVar13) {
              fVar12 = fVar13;
            }
            if (0.0078125 < fVar12) {
              local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::operator<<((ostream *)poVar1,"The functional test\'s expected value (");
              std::ostream::operator<<(poVar1,local_1c8);
              std::operator<<((ostream *)poVar1,") is different than resulted value (");
              std::ostream::operator<<(poVar1,GVar11);
              std::operator<<((ostream *)poVar1,"). The tested mode was ");
              pGVar5 = Utilities::modeToChars(condition_mode_or_query_target);
              std::operator<<((ostream *)poVar1,pGVar5);
              std::operator<<((ostream *)poVar1,". Query was done for target ");
              std::operator<<((ostream *)poVar1,pcVar7);
              std::operator<<((ostream *)poVar1,", and the test was prepared to ");
              pcVar9 = "discard";
              if (bVar3 != false) {
                pcVar9 = "pass";
              }
              std::operator<<((ostream *)poVar1,pcVar9);
              std::operator<<((ostream *)poVar1," all fragments.");
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(poVar1);
              goto LAB_009d960c;
            }
          }
          else {
LAB_009d960c:
            bVar2 = false;
          }
          cleanQueryObject(this);
        }
      }
    }
  }
  else {
    bVar2 = true;
  }
  cleanProgramViewAndVAO(this);
  if (!bVar2) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"The Conditional Render Inverted Functional Test has failed.")
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    pcVar7 = "Fail.";
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    pcVar7 = "Pass";
  }
  tcu::TestContext::setTestResult(this_00,(uint)!bVar2,pcVar7);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult gl4cts::ConditionalRenderInverted::FunctionalTest::iterate()
{
	/* OpenGL support query. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_conditional_render_inverted =
		m_context.getContextInfo().isExtensionSupported("GL_ARB_conditional_render_inverted");

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* This test should only be executed if we're running a GL4.5 context or related extension is available */
	try
	{
		if (is_at_least_gl_45 || is_arb_conditional_render_inverted)
		{
			/* Test cases. */
			static const bool render_cases[] = { false, true };

			static const glw::GLuint render_cases_count = sizeof(render_cases) / sizeof(render_cases[0]);

			static const glw::GLenum query_cases[] = { GL_SAMPLES_PASSED, GL_ANY_SAMPLES_PASSED };

			static const glw::GLuint query_cases_count = sizeof(query_cases) / sizeof(query_cases[0]);

			static const glw::GLenum modes[] = { GL_QUERY_WAIT_INVERTED, GL_QUERY_NO_WAIT_INVERTED,
												 GL_QUERY_BY_REGION_WAIT_INVERTED,
												 GL_QUERY_BY_REGION_NO_WAIT_INVERTED };

			static const glw::GLuint modes_count = sizeof(modes) / sizeof(modes[0]);

			/* Creating common objects. */
			createProgram();
			createView();
			createVertexArrayObject();

			/* Iterating over test cases. */
			for (glw::GLuint i = 0; i < render_cases_count; ++i)
			{
				for (glw::GLuint j = 0; j < query_cases_count; ++j)
				{
					for (glw::GLuint k = 0; k < modes_count; ++k)
					{
						createQueryObject();

						setupColor(1.f);
						setupPassSwitch(render_cases[i]);
						clearView();
						draw(false, query_cases[j]);

						if (render_cases[i] == fragmentsPassed())
						{
							setupColor(0.f);
							setupPassSwitch(true);
							draw(true, modes[k]);

							glw::GLfloat expected_value = (render_cases[i]) ? 1.f : 0.f;
							glw::GLfloat resulted_value = readPixel();

							if (de::abs(expected_value - resulted_value) > 0.0078125f /* Precission (1/128) */)
							{
								m_context.getTestContext().getLog()
									<< tcu::TestLog::Message << "The functional test's expected value ("
									<< expected_value << ") is different than resulted value (" << resulted_value
									<< "). The tested mode was " << Utilities::modeToChars(modes[k])
									<< ". Query was done for target " << Utilities::queryTargetToChars(query_cases[j])
									<< ", and the test was prepared to " << ((render_cases[i]) ? "pass" : "discard")
									<< " all fragments." << tcu::TestLog::EndMessage;

								is_ok = false;
							}
						}
						else
						{
							is_ok = false;
						}

						cleanQueryObject();
					}
				}
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;

		cleanQueryObject();
	}

	/* Clean-up. */
	cleanProgramViewAndVAO();

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "Internal error has occured during Conditional Render Inverted Functional Test."
				<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Test error.");
		}
		else
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "The Conditional Render Inverted Functional Test has failed."
												<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail.");
		}
	}

	return STOP;
}